

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O2

int __thiscall Threadpool<Searchthread>::init(Threadpool<Searchthread> *this,EVP_PKEY_CTX *ctx)

{
  pointer ppSVar1;
  uint uVar2;
  Searchthread *this_00;
  uint uVar3;
  Searchthread *local_70;
  _Bind<void_(Threadpool<Searchthread>::*(Threadpool<Searchthread>_*))()> local_68;
  function<void_()> local_50;
  
  exit(this,(int)ctx);
  ppSVar1 = (this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppSVar1) {
    (this->workers).super__Vector_base<Searchthread_*,_std::allocator<Searchthread_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar1;
  }
  LOCK();
  (this->busy).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->processed).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->stop)._M_base._M_i = false;
  UNLOCK();
  uVar2 = *(uint *)ctx;
  this->num_threads = uVar2;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    this_00 = (Searchthread *)operator_new(0x70);
    local_68._M_f = (offset_in_Threadpool<Searchthread>_to_subr)thread_func;
    local_68._8_8_ = 0;
    local_68._M_bound_args.super__Tuple_impl<0UL,_Threadpool<Searchthread>_*>.
    super__Head_base<0UL,_Threadpool<Searchthread>_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Threadpool<Searchthread>_*>)
         (_Tuple_impl<0UL,_Threadpool<Searchthread>_*>)this;
    std::function<void()>::
    function<std::_Bind<void(Threadpool<Searchthread>::*(Threadpool<Searchthread>*))()>,void>
              ((function<void()> *)&local_50,&local_68);
    Searchthread::Searchthread(this_00,&local_50);
    local_70 = this_00;
    std::vector<Searchthread*,std::allocator<Searchthread*>>::emplace_back<Searchthread*>
              ((vector<Searchthread*,std::allocator<Searchthread*>> *)this,&local_70);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    uVar2 = this->num_threads;
  }
  return uVar2;
}

Assistant:

void init(const int& numThreads) {

		// Clear any existing work..
		exit();
		workers.clear();

		busy = 0;
		processed = 0;
		stop = false;
		num_threads = numThreads;

		for (unsigned int i = 0; i < num_threads; ++i)
			workers.emplace_back(new T(std::bind(&Threadpool<T>::thread_func, this)));
	}